

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int InputTextCalcTextLenAndLineCount(char *text_begin,char **out_text_end)

{
  char cVar1;
  char *pcVar2;
  char c;
  char *s;
  int line_count;
  char **out_text_end_local;
  char *text_begin_local;
  
  line_count = 0;
  s = text_begin;
  while( true ) {
    pcVar2 = s + 1;
    cVar1 = *s;
    if (cVar1 == '\0') break;
    s = pcVar2;
    if (cVar1 == '\n') {
      line_count = line_count + 1;
    }
  }
  if ((*s != '\n') && (*s != '\r')) {
    line_count = line_count + 1;
  }
  *out_text_end = s;
  return line_count;
}

Assistant:

static int InputTextCalcTextLenAndLineCount(const char* text_begin, const char** out_text_end)
{
    int line_count = 0;
    const char* s = text_begin;
    while (char c = *s++) // We are only matching for \n so we can ignore UTF-8 decoding
        if (c == '\n')
            line_count++;
    s--;
    if (s[0] != '\n' && s[0] != '\r')
        line_count++;
    *out_text_end = s;
    return line_count;
}